

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::CMP_ID_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  byte bVar3;
  uint8_t res;
  uint8_t op;
  CPU *this_local;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  uVar2 = ReadWord(this,(ushort)bVar1);
  bVar1 = ReadByte(this,uVar2 + this->Y);
  bVar3 = this->A - bVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfe | bVar1 <= this->A;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == bVar1) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((bVar3 & 0x80) != 0 && -1 < (int)(bVar3 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::CMP_ID_Y()
{
    cycles = 5;
    uint8_t op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}